

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O1

us_timer_t * us_create_timer(us_loop_t *loop,int fallthrough,uint ext_size)

{
  uint uVar1;
  us_timer_t *puVar2;
  
  if (fallthrough == 0) {
    loop->num_polls = loop->num_polls + 1;
  }
  puVar2 = (us_timer_t *)malloc((ulong)(ext_size + 0x30) + 0x10);
  uVar1 = timerfd_create(0,0x80800);
  *(uint *)puVar2 = uVar1 & 0xfffffff | 0x30000000;
  *(us_loop_t **)(puVar2 + 0x10) = loop;
  *(uint *)(puVar2 + 0x18) = 0;
  return puVar2;
}

Assistant:

struct us_timer_t *us_create_timer(struct us_loop_t *loop, int fallthrough, unsigned int ext_size) {
    struct us_poll_t *p = us_create_poll(loop, fallthrough, sizeof(struct us_internal_callback_t) + ext_size);
    us_poll_init(p, timerfd_create(CLOCK_REALTIME, TFD_NONBLOCK | TFD_CLOEXEC), POLL_TYPE_CALLBACK);

    struct us_internal_callback_t *cb = (struct us_internal_callback_t *) p;
    cb->loop = loop;
    cb->cb_expects_the_loop = 0;

    return (struct us_timer_t *) cb;
}